

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_oct.c
# Opt level: O0

REF_STATUS ref_oct_split(REF_OCT ref_oct,REF_INT node)

{
  int iVar1;
  REF_INT *pRVar2;
  int local_40;
  REF_INT max_limit;
  REF_INT chunk;
  REF_INT orig;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  REF_INT i;
  REF_INT node_local;
  REF_OCT ref_oct_local;
  
  if (node < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_oct.c",0xa2,
           "ref_oct_split","node negative");
    ref_oct_local._4_4_ = 1;
  }
  else if (node < ref_oct->n) {
    if (node < ref_oct->max) {
      for (ref_private_status_reis_ai._0_4_ = 0; (int)ref_private_status_reis_ai < 8;
          ref_private_status_reis_ai._0_4_ = (int)ref_private_status_reis_ai + 1) {
        if ((long)ref_oct->children[(int)ref_private_status_reis_ai + node * 8] != -1) {
          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_oct.c",
                 0xa6,"ref_oct_split","child not empty",0xffffffffffffffff,
                 (long)ref_oct->children[(int)ref_private_status_reis_ai + node * 8]);
          return 1;
        }
      }
      if (ref_oct->max < ref_oct->n + 8) {
        iVar1 = ref_oct->max;
        local_40 = (int)((double)iVar1 * 1.5);
        if (0x4bda12f - iVar1 < 1) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_oct.c",
                 0xae,"ref_oct_split","chunk limit at max");
          return 1;
        }
        if (0x4bda12f - iVar1 <= local_40) {
          local_40 = 0x4bda12f - iVar1;
        }
        ref_oct->max = iVar1 + local_40;
        fflush(_stdout);
        if (0 < ref_oct->max * 8) {
          pRVar2 = (REF_INT *)realloc(ref_oct->children,(long)(ref_oct->max << 3) << 2);
          ref_oct->children = pRVar2;
        }
        if (ref_oct->children == (REF_INT *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_oct.c",
                 0xb1,"ref_oct_split","realloc ref_oct->children NULL");
          printf("failed to realloc n int %d uLong %lu size_of %lu = %lu\n",
                 (ulong)(uint)(ref_oct->max << 3),(long)(ref_oct->max << 3),4,
                 (long)(ref_oct->max << 3) << 2);
          return 2;
        }
        fflush(_stdout);
        if (0 < ref_oct->max * 0x1b) {
          pRVar2 = (REF_INT *)realloc(ref_oct->nodes,(long)(ref_oct->max * 0x1b) << 2);
          ref_oct->nodes = pRVar2;
        }
        if (ref_oct->nodes == (REF_INT *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_oct.c",
                 0xb2,"ref_oct_split","realloc ref_oct->nodes NULL");
          printf("failed to realloc n int %d uLong %lu size_of %lu = %lu\n",
                 (ulong)(uint)(ref_oct->max * 0x1b),(long)(ref_oct->max * 0x1b),4,
                 (long)(ref_oct->max * 0x1b) << 2);
          return 2;
        }
        for (ref_private_status_reis_ai._0_4_ = iVar1 << 3;
            (int)ref_private_status_reis_ai < ref_oct->max * 8;
            ref_private_status_reis_ai._0_4_ = (int)ref_private_status_reis_ai + 1) {
          ref_oct->children[(int)ref_private_status_reis_ai] = -1;
        }
        for (ref_private_status_reis_ai._0_4_ = iVar1 * 0x1b;
            SBORROW4((int)ref_private_status_reis_ai,ref_oct->max * 0x1b) !=
            (int)ref_private_status_reis_ai + ref_oct->max * -0x1b < 0;
            ref_private_status_reis_ai._0_4_ = (int)ref_private_status_reis_ai + 1) {
          ref_oct->nodes[(int)ref_private_status_reis_ai] = -1;
        }
      }
      for (ref_private_status_reis_ai._0_4_ = 0; (int)ref_private_status_reis_ai < 8;
          ref_private_status_reis_ai._0_4_ = (int)ref_private_status_reis_ai + 1) {
        ref_oct->children[(int)ref_private_status_reis_ai + node * 8] = ref_oct->n;
        ref_oct->n = ref_oct->n + 1;
      }
      ref_oct_local._4_4_ = 0;
    }
    else {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_oct.c",0xa4,
             "ref_oct_split","node larger than max");
      ref_oct_local._4_4_ = 1;
    }
  }
  else {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_oct.c",0xa3,
           "ref_oct_split","node larger than n");
    ref_oct_local._4_4_ = 1;
  }
  return ref_oct_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_oct_split(REF_OCT ref_oct, REF_INT node) {
  REF_INT i;
  RAS(node >= 0, "node negative");
  RAS(node < ref_oct_n(ref_oct), "node larger than n");
  RAS(node < ref_oct_max(ref_oct), "node larger than max");
  for (i = 0; i < 8; i++) {
    REIS(REF_EMPTY, ref_oct_child(ref_oct, i, node), "child not empty");
  }
  if (ref_oct_n(ref_oct) + 8 > ref_oct_max(ref_oct)) {
    REF_INT orig, chunk;
    REF_INT max_limit = REF_INT_MAX / 27;
    orig = ref_oct_max(ref_oct);
    /* geometric growth for efficiency */
    chunk = (REF_INT)(1.5 * (REF_DBL)orig);
    RAS(max_limit - orig > 0, "chunk limit at max");
    chunk = MIN(chunk, max_limit - orig);
    ref_oct_max(ref_oct) = orig + chunk;
    ref_realloc(ref_oct->children, 8 * ref_oct->max, REF_INT);
    ref_realloc(ref_oct->nodes, 27 * ref_oct->max, REF_INT);
    for (i = 8 * orig; i < 8 * ref_oct_max(ref_oct); i++)
      ref_oct->children[i] = REF_EMPTY;
    for (i = 27 * orig; i < 27 * ref_oct_max(ref_oct); i++)
      ref_oct->nodes[i] = REF_EMPTY;
  }
  for (i = 0; i < 8; i++) {
    ref_oct_child(ref_oct, i, node) = ref_oct_n(ref_oct);
    (ref_oct_n(ref_oct))++;
  }
  return REF_SUCCESS;
}